

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::generateMessages
          (CommonCore *this,ActionMessage *message,
          vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *targets)

{
  ActionMessage *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference ppVar5;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RDX;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  int res;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *__range1;
  ActionMessage package;
  ActionMessage *in_stack_fffffffffffffdd8;
  ActionMessage *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf8;
  string_view in_stack_fffffffffffffe08;
  ActionMessage *in_stack_fffffffffffffe18;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffe20;
  Time in_stack_fffffffffffffe28;
  __normal_iterator<const_std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  local_f8;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_f0;
  ActionMessage local_e8;
  size_t local_30;
  char *local_28;
  GlobalHandle local_20;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  setActionFlag<helics::ActionMessage,helics::MessageFlags>(in_RSI,filter_processing_required_flag);
  sVar3 = std::
          vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::size(local_18);
  this_00 = local_10;
  if (sVar3 == 1) {
    pvVar4 = std::
             vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::front((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      *)in_stack_fffffffffffffde0);
    local_20 = pvVar4->first;
    ActionMessage::setDestination(this_00,local_20);
    pvVar4 = std::
             vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::front((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      *)in_stack_fffffffffffffde0);
    local_30 = (pvVar4->second)._M_len;
    local_28 = (pvVar4->second)._M_str;
    ActionMessage::setString(in_RDI,local_10._4_4_,in_stack_fffffffffffffe08);
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    push<helics::ActionMessage>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  else {
    ActionMessage::ActionMessage(in_RDI,(action_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    local_e8.source_id.gid = (local_10->source_id).gid;
    local_e8.source_handle.hid = (local_10->source_handle).hid;
    local_f0 = local_18;
    local_f8._M_current =
         (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
         std::
         vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
         ::begin((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)in_stack_fffffffffffffdd8);
    std::
    vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::end((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           *)in_stack_fffffffffffffdd8);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                        ((__normal_iterator<const_std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffde0,
                         (__normal_iterator<const_std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<const_std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
               ::operator*(&local_f8);
      ActionMessage::setDestination(local_10,ppVar5->first);
      ActionMessage::setString
                (in_RDI,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffe08);
      iVar2 = appendMessage((ActionMessage *)in_stack_fffffffffffffe28.internalTimeCode,
                            (ActionMessage *)in_stack_fffffffffffffe20);
      if (iVar2 < 0) {
        gmlc::containers::
        BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
        push<helics::ActionMessage>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        ActionMessage::ActionMessage(in_RDI,(action_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        in_stack_fffffffffffffde0 = &local_e8;
        in_stack_fffffffffffffdd8 = (ActionMessage *)&stack0xfffffffffffffe08;
        ActionMessage::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffde0);
        local_e8.source_id.gid = (local_10->source_id).gid;
        local_e8.source_handle.hid = (local_10->source_handle).hid;
        appendMessage((ActionMessage *)in_stack_fffffffffffffe28.internalTimeCode,
                      (ActionMessage *)in_stack_fffffffffffffe20);
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
      ::operator++(&local_f8);
    }
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    push<helics::ActionMessage>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffde0);
  }
  return;
}

Assistant:

void CommonCore::generateMessages(
    ActionMessage& message,
    const std::vector<std::pair<GlobalHandle, std::string_view>>& targets)
{
    setActionFlag(message, filter_processing_required_flag);
    if (targets.size() == 1) {
        message.setDestination(targets.front().first);
        message.setString(0, targets.front().second);
        actionQueue.push(std::move(message));
        return;
    }
    /** now generate a multimessage*/
    ActionMessage package(CMD_MULTI_MESSAGE);
    package.source_id = message.source_id;
    package.source_handle = message.source_handle;

    for (const auto& target : targets) {
        message.setDestination(target.first);
        message.setString(0, target.second);
        auto res = appendMessage(package, message);
        if (res < 0)  // deal with max package size if there are a lot of subscribers
        {
            actionQueue.push(std::move(package));
            package = ActionMessage(CMD_MULTI_MESSAGE);
            package.source_id = message.source_id;
            package.source_handle = message.source_handle;
            appendMessage(package, message);
        }
    }
    actionQueue.push(std::move(package));
}